

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool dummy [4];
  bool at_end;
  bool local_51;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffffb8;
  ParamIterator<(anonymous_namespace)::kfIntervalParam> *other;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x576e13);
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x576e26);
  local_b._2_1_ =
       ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                 ((ParamIterator<const_libaom_test::CodecFactory_*> *)
                  CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576e73);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576e86);
    local_21 = ParamIterator<libaom_test::TestMode>::operator==
                         ((ParamIterator<libaom_test::TestMode> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffffb8);
  }
  local_b._2_1_ = local_21;
  other = (ParamIterator<(anonymous_namespace)::kfIntervalParam> *)&local_b;
  uVar1 = true;
  if (local_21 == false) {
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576ed7);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576eea);
    uVar1 = ParamIterator<(anonymous_namespace)::kfIntervalParam>::operator==
                      ((ParamIterator<(anonymous_namespace)::kfIntervalParam> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffc0),other);
  }
  local_b._2_1_ = uVar1;
  *(undefined1 *)
   &(other->impl_)._M_t.
    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::kfIntervalParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::kfIntervalParam>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::kfIntervalParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::kfIntervalParam>_>_>
    .
    super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::kfIntervalParam>_*,_false>
    ._M_head_impl = uVar1;
  local_51 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576f3b);
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::kfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x576f4d);
    local_51 = ParamIterator<aom_rc_mode>::operator==
                         ((ParamIterator<aom_rc_mode> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                          (ParamIterator<aom_rc_mode> *)other);
  }
  return local_51;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }